

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

bool CSOAA::test_ldf_sequence(ldf *data,size_t start_K,multi_ex *ec_seq)

{
  byte bVar1;
  bool bVar2;
  example *peVar3;
  example *peVar4;
  reference ppeVar5;
  ostream *poVar6;
  undefined8 uVar7;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  example *in_RSI;
  long in_RDI;
  stringstream __msg;
  example *ec;
  size_t k;
  bool isTest;
  code *in_stack_fffffffffffffe00;
  int plineNumber;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 uVar8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  value_type local_30;
  example *local_28;
  byte local_19;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  example *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  peVar3 = (example *)std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if (in_RSI == peVar3) {
    local_19 = 1;
  }
  else {
    in_stack_fffffffffffffe00 = (code *)PTR_test_label_0047ccd0;
    ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_18,(size_type)local_10);
    local_19 = (*in_stack_fffffffffffffe00)(&(*ppeVar5)->l);
    local_19 = local_19 & 1;
  }
  local_28 = local_10;
  while( true ) {
    peVar3 = local_28;
    peVar4 = (example *)std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    if (peVar4 <= peVar3) {
      return (bool)(local_19 & 1);
    }
    ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_18,(size_type)local_28);
    local_30 = *ppeVar5;
    bVar1 = (*(code *)PTR_test_label_0047ccd0)(&local_30->l);
    if ((bVar1 & 1) != (local_19 & 1)) {
      local_19 = 1;
      poVar6 = std::operator<<((ostream *)(*(long *)(local_8 + 0xc0) + 0xe0),
                               "warning: ldf example has mix of train/test data; assuming test");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    bVar2 = COST_SENSITIVE::ec_is_example_header(peVar3);
    plineNumber = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    if (bVar2) break;
    local_28 = (example *)((long)&(local_28->super_example_predict).indices._begin + 1);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar6 = std::operator<<(&local_1a8,"warning: example headers at position ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)local_28);
  std::operator<<(poVar6,": can only have in initial position!");
  uVar8 = 1;
  uVar7 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            ((vw_exception *)CONCAT17(uVar8,in_stack_fffffffffffffe10),(char *)in_RSI,plineNumber,
             (string *)peVar3);
  __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool test_ldf_sequence(ldf& data, size_t start_K, multi_ex& ec_seq)
{
  bool isTest;
  if (start_K == ec_seq.size())
    isTest = true;
  else
    isTest = COST_SENSITIVE::cs_label.test_label(&ec_seq[start_K]->l);
  for (size_t k = start_K; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    // Each sub-example must have just one cost
    assert(ec->l.cs.costs.size() == 1);

    if (COST_SENSITIVE::cs_label.test_label(&ec->l) != isTest)
    {
      isTest = true;
      data.all->trace_message << "warning: ldf example has mix of train/test data; assuming test" << endl;
    }
    if (ec_is_example_header(*ec))
      THROW("warning: example headers at position " << k << ": can only have in initial position!");
  }
  return isTest;
}